

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.c
# Opt level: O1

void ts_stack_record_summary(Stack *self,StackVersion version,uint max_depth)

{
  uint32_t *puVar1;
  TSStateId TVar2;
  uint32_t uVar3;
  StackNode *pSVar4;
  StackIterator *pSVar5;
  StackNode *pSVar6;
  Subtree *pSVar7;
  undefined8 uVar8;
  uint32_t uVar9;
  byte bVar10;
  uint uVar11;
  StackSummary *pSVar12;
  StackIterator *pSVar13;
  StackSummaryEntry *pSVar14;
  ulong uVar15;
  char cVar16;
  SubtreeArray *pSVar17;
  uint uVar18;
  uint uVar19;
  long lVar20;
  StackNode *pSVar21;
  ulong uVar22;
  _Bool *p_Var23;
  bool bVar24;
  size_t __size;
  uint uVar25;
  SubtreeHeapData *pSVar26;
  uint uVar27;
  ulong uVar28;
  bool bVar29;
  
  pSVar12 = (StackSummary *)malloc(0x10);
  if (pSVar12 == (StackSummary *)0x0) {
LAB_00130f9e:
    ts_stack_record_summary_cold_7();
LAB_00130fa3:
    __assert_fail("(uint32_t)version < (&self->heads)->size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/stack.c"
                  ,0x118,
                  "StackSliceArray stack__iter(Stack *, StackVersion, StackCallback, void *, int)");
  }
  pSVar12->contents = (StackSummaryEntry *)0x0;
  pSVar12->size = 0;
  pSVar12->capacity = 0;
  (self->slices).size = 0;
  (self->iterators).size = 0;
  if ((self->heads).size <= version) goto LAB_00130fa3;
  pSVar4 = (self->heads).contents[version].node;
  uVar25 = (self->iterators).capacity;
  if ((self->iterators).size != uVar25) goto LAB_00130b84;
  uVar11 = 8;
  if (8 < uVar25 * 2) {
    uVar11 = uVar25 * 2;
  }
  if (uVar11 <= uVar25) goto LAB_00130b84;
  pSVar13 = (self->iterators).contents;
  __size = (size_t)uVar11;
  if (pSVar13 == (StackIterator *)0x0) {
LAB_00130b5d:
    uVar25 = 0x20;
    pSVar13 = (StackIterator *)calloc(__size,0x20);
    if (pSVar13 == (StackIterator *)0x0) {
LAB_00130fcc:
      ts_stack_record_summary_cold_6();
      if (*(uint *)(__size + 8) <= uVar25) {
        __assert_fail("(uint32_t)version < (&self->heads)->size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/stack.c"
                      ,0x240,"StackSummary *ts_stack_get_summary(Stack *, StackVersion)");
      }
      return;
    }
  }
  else {
    __size = __size << 5;
    pSVar13 = (StackIterator *)realloc(pSVar13,__size);
    if (pSVar13 == (StackIterator *)0x0) {
      ts_stack_record_summary_cold_1();
      goto LAB_00130b5d;
    }
  }
  (self->iterators).contents = pSVar13;
  (self->iterators).capacity = uVar11;
LAB_00130b84:
  pSVar13 = (self->iterators).contents;
  uVar25 = (self->iterators).size;
  (self->iterators).size = uVar25 + 1;
  pSVar13[uVar25].node = pSVar4;
  pSVar17 = &pSVar13[uVar25].subtrees;
  pSVar17->contents = (Subtree *)0x0;
  pSVar17->size = 0;
  pSVar17->capacity = 0;
  pSVar13[uVar25].subtree_count = 0;
  pSVar13[uVar25].is_pending = true;
  uVar11 = (self->iterators).size;
  if (uVar11 != 0) {
    uVar22 = 0;
    do {
      do {
        pSVar13 = (self->iterators).contents;
        __size = uVar22 * 0x20;
        uVar27 = pSVar13[uVar22].subtree_count;
        uVar18 = (uint)uVar22;
        if (max_depth < uVar27) {
LAB_00130eb8:
          ts_subtree_array_delete(self->subtree_pool,&pSVar13[uVar22].subtrees);
          uVar25 = (self->iterators).size;
          if (uVar25 <= uVar18) {
            __assert_fail("index < self->size",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/array.h"
                          ,0x4f,"void array__erase(VoidArray *, size_t, uint32_t)");
          }
          pSVar13 = (self->iterators).contents;
          memmove(pSVar13 + uVar22,pSVar13 + uVar22 + 1,(ulong)(uVar25 + ~uVar18) << 5);
          puVar1 = &(self->iterators).size;
          *puVar1 = *puVar1 - 1;
          uVar11 = uVar11 - 1;
        }
        else {
          pSVar4 = pSVar13[uVar22].node;
          TVar2 = pSVar4->state;
          lVar20 = (ulong)pSVar12->size * 0x14;
          do {
            if (lVar20 + -0x14 == -0x14) {
              cVar16 = '\x02';
              break;
            }
            uVar25 = *(uint *)((long)pSVar12->contents + lVar20 + -8);
            if (uVar25 < uVar27) {
              cVar16 = '\x02';
              bVar24 = false;
            }
            else {
              bVar29 = *(TSStateId *)((long)pSVar12->contents + lVar20 + -4) != TVar2;
              bVar24 = bVar29 || uVar25 != uVar27;
              cVar16 = !bVar29 && uVar25 == uVar27;
            }
            lVar20 = lVar20 + -0x14;
          } while (bVar24);
          if (cVar16 == '\x02') {
            uVar25 = pSVar12->capacity;
            if (pSVar12->size == uVar25) {
              uVar19 = uVar25 * 2;
              if (uVar19 < 9) {
                uVar19 = 8;
              }
              if (uVar25 < uVar19) {
                if (pSVar12->contents == (StackSummaryEntry *)0x0) {
                  uVar25 = 0x14;
                  pSVar14 = (StackSummaryEntry *)calloc((ulong)uVar19,0x14);
                  if (pSVar14 == (StackSummaryEntry *)0x0) {
                    ts_stack_record_summary_cold_5();
                    goto LAB_00130fcc;
                  }
                }
                else {
                  pSVar14 = (StackSummaryEntry *)realloc(pSVar12->contents,(ulong)uVar19 * 0x14);
                  if (pSVar14 == (StackSummaryEntry *)0x0) {
LAB_00130f94:
                    ts_stack_record_summary_cold_2();
                    goto LAB_00130f9e;
                  }
                }
                pSVar12->contents = pSVar14;
                pSVar12->capacity = uVar19;
              }
            }
            pSVar14 = pSVar12->contents;
            uVar25 = pSVar12->size;
            pSVar12->size = uVar25 + 1;
            pSVar21 = pSVar13[uVar22].node;
            uVar3 = (pSVar21->position).bytes;
            uVar9 = (pSVar21->position).extent.row;
            pSVar14[uVar25].position.extent.column = (pSVar21->position).extent.column;
            pSVar14[uVar25].position.bytes = uVar3;
            pSVar14[uVar25].position.extent.row = uVar9;
            pSVar14[uVar25].depth = uVar27;
            pSVar14[uVar25].state = TVar2;
          }
          if ((max_depth < uVar27) || (pSVar4->link_count == 0)) goto LAB_00130eb8;
          uVar15 = (ulong)pSVar4->link_count;
          if (pSVar4->link_count != 0) {
            p_Var23 = &pSVar4->links[1].is_pending;
            uVar28 = 0;
            do {
              uVar28 = uVar28 + 1;
              if (uVar28 == uVar15) {
                pSVar21 = pSVar4->links[0].node;
                pSVar26 = pSVar4->links[0].subtree.ptr;
                bVar10 = pSVar4->links[0].is_pending;
                pSVar13 = (self->iterators).contents + uVar22;
LAB_00130e59:
                pSVar13->node = pSVar21;
                if (pSVar26 == (SubtreeHeapData *)0x0) {
                  pSVar13->subtree_count = pSVar13->subtree_count + 1;
                }
                else {
                  if (((ulong)pSVar26 & 1) == 0) {
                    uVar25 = *(uint *)&pSVar26->field_0x2c >> 2;
                  }
                  else {
                    uVar25 = (uint)((ulong)pSVar26 >> 3) & 0x1fffffff;
                  }
                  if (((uVar25 & 1) != 0) ||
                     (pSVar13->subtree_count = pSVar13->subtree_count + 1, (bVar10 & 1) != 0))
                  goto LAB_00130e91;
                }
                pSVar13->is_pending = false;
              }
              else if ((self->iterators).size < 0x40) {
                pSVar21 = ((StackLink *)(p_Var23 + -0x10))->node;
                pSVar26 = ((Subtree *)(p_Var23 + -8))->ptr;
                bVar10 = *p_Var23;
                pSVar13 = (self->iterators).contents;
                pSVar6 = pSVar13[uVar22].node;
                pSVar7 = pSVar13[uVar22].subtrees.contents;
                pSVar17 = &pSVar13[uVar22].subtrees;
                uVar3 = pSVar17->size;
                uVar9 = pSVar17->capacity;
                uVar8 = pSVar17[1].contents;
                uVar25 = (self->iterators).capacity;
                if ((self->iterators).size == uVar25) {
                  uVar27 = uVar25 * 2;
                  if (uVar27 < 9) {
                    uVar27 = 8;
                  }
                  if (uVar25 < uVar27) {
                    if (pSVar13 == (StackIterator *)0x0) {
                      pSVar13 = (StackIterator *)calloc((ulong)uVar27,0x20);
                      if (pSVar13 != (StackIterator *)0x0) goto LAB_00130de7;
                    }
                    else {
                      pSVar13 = (StackIterator *)realloc(pSVar13,(ulong)uVar27 << 5);
                      if (pSVar13 != (StackIterator *)0x0) {
LAB_00130de7:
                        (self->iterators).contents = pSVar13;
                        (self->iterators).capacity = uVar27;
                        goto LAB_00130df3;
                      }
                      ts_stack_record_summary_cold_3();
                    }
                    ts_stack_record_summary_cold_4();
                    goto LAB_00130f94;
                  }
                }
LAB_00130df3:
                pSVar13 = (self->iterators).contents;
                uVar25 = (self->iterators).size;
                (self->iterators).size = uVar25 + 1;
                pSVar5 = pSVar13 + uVar25;
                (pSVar5->subtrees).size = uVar3;
                (pSVar5->subtrees).capacity = uVar9;
                *(undefined8 *)(&(pSVar5->subtrees).size + 2) = uVar8;
                pSVar13 = pSVar13 + uVar25;
                pSVar13->node = pSVar6;
                (pSVar13->subtrees).contents = pSVar7;
                uVar3 = (self->iterators).size;
                if (uVar3 == 0) {
                  __assert_fail("(uint32_t)(&self->iterators)->size - 1 < (&self->iterators)->size",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/stack.c"
                                ,0x151,
                                "StackSliceArray stack__iter(Stack *, StackVersion, StackCallback, void *, int)"
                               );
                }
                uVar25 = uVar3 - 1;
                pSVar5 = (self->iterators).contents;
                pSVar13 = pSVar5 + uVar25;
                pSVar17 = &pSVar5[uVar25].subtrees;
                ts_subtree_array_copy(*pSVar17,pSVar17);
                goto LAB_00130e59;
              }
LAB_00130e91:
              uVar15 = (ulong)pSVar4->link_count;
              p_Var23 = p_Var23 + 0x18;
            } while (uVar28 < uVar15);
          }
          uVar22 = (ulong)(uVar18 + 1);
        }
      } while ((uint)uVar22 < uVar11);
      uVar11 = (self->iterators).size;
      uVar22 = 0;
    } while (uVar11 != 0);
  }
  (self->heads).contents[version].summary = pSVar12;
  return;
}

Assistant:

void ts_stack_record_summary(Stack *self, StackVersion version, unsigned max_depth) {
  SummarizeStackSession session = {
    .summary = ts_malloc(sizeof(StackSummary)),
    .max_depth = max_depth
  };
  array_init(session.summary);
  stack__iter(self, version, summarize_stack_callback, &session, -1);
  self->heads.contents[version].summary = session.summary;
}